

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Pubkey * __thiscall cfd::core::Pubkey::Uncompress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  CfdException *this_00;
  allocator local_85;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompress_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38;
  
  bVar1 = IsCompress(this);
  if (bVar1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&decompress_data,0x41,(allocator_type *)&local_38);
    ByteData::GetBytes(&data,&this->data_);
    ret = wally_ec_public_key_decompress
                    (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                     decompress_data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)decompress_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)decompress_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    if (ret != 0) {
      local_38._M_dataplus._M_p = "cfdcore_key.cpp";
      local_38._M_string_length._0_4_ = 0x96;
      local_38.field_2._M_allocated_capacity = (long)"Parse_Privkey_Mainnet_Uncompress" + 0x16;
      logger::warn<int&>((CfdSourceLocation *)&local_38,
                         "wally_ec_public_key_decompress error. ret={}",&ret);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_38,"Failed to uncompress pubkey.",&local_85);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_38);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)&local_50,&decompress_data);
    Pubkey(__return_storage_ptr__,(ByteData *)&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&decompress_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Uncompress() const {
  if (!IsCompress()) {
    return *this;
  }

  // The conversion from uncompress to compress is irreversible.
  // (if convert compress to uncompress, prefix is '04'. Not '06' or '07'.)
  std::vector<uint8_t> decompress_data(EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
  std::vector<uint8_t> data = data_.GetBytes();
  int ret = wally_ec_public_key_decompress(
      data.data(), data.size(), decompress_data.data(),
      decompress_data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_public_key_decompress error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to uncompress pubkey.");
  }
  return Pubkey(decompress_data);
}